

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LoadConstantLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_loadconstant(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  LoadConstantLayerParams *pLVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_loadconstant(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_loadconstant(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pLVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::LoadConstantLayerParams>(arena);
    (this->layer_).loadconstant_ = pLVar2;
  }
  return (LoadConstantLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LoadConstantLayerParams* NeuralNetworkLayer::_internal_mutable_loadconstant() {
  if (!_internal_has_loadconstant()) {
    clear_layer();
    set_has_loadconstant();
    layer_.loadconstant_ = CreateMaybeMessage< ::CoreML::Specification::LoadConstantLayerParams >(GetArenaForAllocation());
  }
  return layer_.loadconstant_;
}